

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O1

bool mg::data::nam_read(string *data,Nam *out)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  pointer local_48;
  char *str;
  int local_34 [2];
  int len;
  
  str = (char *)data->_M_string_length;
  if (((ulong)str & 0x1f) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&out->names,
                      (out->names).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    if (data->_M_string_length != 0) {
      lVar3 = 1;
      uVar4 = 0;
      do {
        local_34[0] = 0;
        pcVar1 = (data->_M_dataplus)._M_p;
        local_48 = pcVar1 + uVar4;
        lVar2 = 0;
        do {
          if (pcVar1[lVar2 + lVar3 + -1] == '\r') {
            if (pcVar1[lVar2 + lVar3] == '\n') goto LAB_00102654;
          }
          else if (pcVar1[lVar2 + lVar3 + -1] == '\0') goto LAB_00102654;
          lVar2 = lVar2 + 1;
          local_34[0] = (int)lVar2;
        } while (lVar2 != 0x20);
        lVar2 = 1;
LAB_00102654:
        if ((int)lVar2 != 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&,int&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
                     &local_48,local_34);
        }
        uVar4 = uVar4 + 0x20;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < data->_M_string_length);
    }
  }
  else {
    nam_read();
  }
  return ((ulong)str & 0x1f) == 0;
}

Assistant:

bool nam_read(const std::string &data, Nam &out) {
  // If this file isn't aligned to MAX_STRLEN byte entries, it might not be a
  // NAM
  if (data.size() % Nam::MAX_STRLEN != 0) {
    fprintf(stderr, "Wrong size for NAM data file\n");
    return false;
  }

  // Clear output
  out.names.clear();

  // Iterate each record and add
  std::string::size_type read_offset = 0;
  while (read_offset < data.size()) {
    // Read up to nul byte, max strlen or \r\n
    int len = 0;
    const char *str = &data[read_offset];
    for (; len < Nam::MAX_STRLEN && str[len] != '\0' &&
           !(str[len] == '\r' && str[len + 1] == '\n');
         len++) {
    }
    if (len != 0) {
      out.names.emplace_back(str, len);
    }

    read_offset += Nam::MAX_STRLEN;
  }

  return true;
}